

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<kj::StringPtr>::setCapacity(Vector<kj::StringPtr> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<kj::StringPtr> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<kj::StringPtr> newBuilder;
  size_t newSize_local;
  Vector<kj::StringPtr> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<kj::StringPtr>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<kj::StringPtr>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<kj::StringPtr>
            ((ArrayBuilder<kj::StringPtr> *)local_38,(size_t)newBuilder.disposer);
  pAVar2 = mv<kj::ArrayBuilder<kj::StringPtr>>(&this->builder);
  ArrayBuilder<kj::StringPtr>::addAll<kj::ArrayBuilder<kj::StringPtr>>
            ((ArrayBuilder<kj::StringPtr> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<kj::StringPtr>>((ArrayBuilder<kj::StringPtr> *)local_38);
  ArrayBuilder<kj::StringPtr>::operator=(&this->builder,pAVar2);
  ArrayBuilder<kj::StringPtr>::~ArrayBuilder((ArrayBuilder<kj::StringPtr> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }